

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlNode * __thiscall despot::util::tinyxml::TiXmlUnknown::Clone(TiXmlUnknown *this)

{
  TiXmlUnknown *clone;
  TiXmlUnknown *this_local;
  
  this_local = (TiXmlUnknown *)operator_new(0x50);
  TiXmlUnknown(this_local);
  if (this_local == (TiXmlUnknown *)0x0) {
    this_local = (TiXmlUnknown *)0x0;
  }
  else {
    CopyTo(this,this_local);
  }
  return &this_local->super_TiXmlNode;
}

Assistant:

TiXmlNode* TiXmlUnknown::Clone() const {
	TiXmlUnknown* clone = new TiXmlUnknown();

	if (!clone)
		return 0;

	CopyTo(clone);
	return clone;
}